

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O2

ngx_int_t ngx_strcasecmp(u_char *s1,u_char *s2)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  lVar3 = 0;
  while( true ) {
    bVar1 = s1[lVar3];
    bVar2 = s2[lVar3];
    uVar4 = (ulong)bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      uVar4 = (ulong)bVar1;
    }
    uVar5 = (ulong)bVar2 | 0x20;
    if (0x19 < (byte)(bVar2 + 0xbf)) {
      uVar5 = (ulong)bVar2;
    }
    if (uVar4 - uVar5 != 0) break;
    lVar3 = lVar3 + 1;
    if (uVar4 == 0) {
      return 0;
    }
  }
  return uVar4 - uVar5;
}

Assistant:

ngx_int_t
ngx_strcasecmp(u_char *s1, u_char *s2)
{
    ngx_uint_t  c1, c2;

    for ( ;; ) {
        c1 = (ngx_uint_t) *s1++;
        c2 = (ngx_uint_t) *s2++;

        c1 = (c1 >= 'A' && c1 <= 'Z') ? (c1 | 0x20) : c1;
        c2 = (c2 >= 'A' && c2 <= 'Z') ? (c2 | 0x20) : c2;

        if (c1 == c2) {

            if (c1) {
                continue;
            }

            return 0;
        }

        return c1 - c2;
    }
}